

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UBool icu_63::calcNameSetsLengths(UErrorCode *pErrorCode)

{
  byte bVar1;
  ushort tokenCount;
  uint *puVar2;
  UBool UVar3;
  int32_t iVar4;
  uint uVar5;
  long lVar6;
  int8_t *tokenLengths;
  uint8_t *puVar7;
  uint uVar8;
  ushort *puVar9;
  int *piVar10;
  uint8_t *puVar11;
  uint16_t *tokens;
  int iVar12;
  int iVar13;
  uint8_t **pLine;
  char *s;
  ulong uVar14;
  uint32_t *puVar15;
  uint uVar16;
  uint8_t *lineLimit;
  bool bVar17;
  uint8_t *line;
  uint *local_e0;
  ushort *local_d8;
  uint16_t *local_d0;
  uint16_t lengths [34];
  uint16_t offsets [34];
  
  if (gMaxNameLength == 0) {
    UVar3 = isDataLoaded(pErrorCode);
    if (UVar3 == '\0') {
      UVar3 = '\0';
    }
    else {
      s = (char *)0x1;
      for (lVar6 = 0; puVar2 = uCharNames, lVar6 != 0x13; lVar6 = lVar6 + 1) {
        *(uint *)(gNameSet + (ulong)((byte)"0123456789ABCDEF<>-"[lVar6] >> 5) * 4) =
             *(uint *)(gNameSet + (ulong)((byte)"0123456789ABCDEF<>-"[lVar6] >> 5) * 4) |
             1 << ("0123456789ABCDEF<>-"[lVar6] & 0x1fU);
      }
      piVar10 = (int *)((long)uCharNames + (ulong)uCharNames[3]) + 1;
      iVar12 = *(int *)((long)uCharNames + (ulong)uCharNames[3]);
      lineLimit = (uint8_t *)0x0;
      while (bVar17 = iVar12 != 0, iVar12 = iVar12 + -1, bVar17) {
        if ((char)piVar10[2] == '\x01') {
          bVar1 = *(byte *)((long)piVar10 + 9);
          puVar15 = (uint32_t *)((long)piVar10 + (ulong)bVar1 * 2 + 0xc);
          uVar8 = calcStringSetLength(puVar15,s);
          puVar15 = (uint32_t *)((long)puVar15 + (long)(int)uVar8 + 1);
          for (uVar14 = 0; uVar14 != bVar1; uVar14 = uVar14 + 1) {
            iVar13 = 0;
            for (uVar16 = (uint)*(ushort *)((long)piVar10 + uVar14 * 2 + 0xc); 0 < (int)uVar16;
                uVar16 = uVar16 - 1) {
              iVar4 = calcStringSetLength(puVar15,s);
              puVar15 = (uint32_t *)((long)puVar15 + (long)iVar4 + 1);
              if (iVar13 < iVar4) {
                iVar13 = iVar4;
              }
            }
            uVar8 = uVar8 + iVar13;
          }
          iVar13 = (int)lineLimit;
          lineLimit = (uint8_t *)((ulong)lineLimit & 0xffffffff);
          if (iVar13 < (int)uVar8) {
            lineLimit = (uint8_t *)(ulong)uVar8;
          }
        }
        else if ((char)piVar10[2] == '\0') {
          iVar4 = calcStringSetLength((uint32_t *)(piVar10 + 3),s);
          uVar8 = (uint)*(byte *)((long)piVar10 + 9) + iVar4;
          if ((int)lineLimit < (int)uVar8) {
            lineLimit = (uint8_t *)(ulong)uVar8;
          }
        }
        piVar10 = (int *)((long)piVar10 + (ulong)*(ushort *)((long)piVar10 + 10));
      }
      for (lVar6 = 0; lVar6 != 0x108; lVar6 = lVar6 + 8) {
        iVar4 = calcStringSetLength(*(uint32_t **)((long)&charCatNames + lVar6),s);
        if ((int)lineLimit < (int)(iVar4 + 9U)) {
          lineLimit = (uint8_t *)(ulong)(iVar4 + 9U);
        }
      }
      tokenCount = (ushort)puVar2[4];
      uVar8 = *puVar2;
      tokenLengths = (int8_t *)uprv_malloc_63((ulong)tokenCount);
      if (tokenLengths != (int8_t *)0x0) {
        memset(tokenLengths,0,(ulong)tokenCount);
      }
      tokens = (uint16_t *)((long)puVar2 + 0x12);
      local_e0 = uCharNames;
      puVar9 = (ushort *)((long)uCharNames + (ulong)uCharNames[1]) + 1;
      local_d0 = tokens;
      for (uVar16 = (uint)*(ushort *)((long)uCharNames + (ulong)uCharNames[1]); 0 < (int)uVar16;
          uVar16 = uVar16 - 1) {
        local_d8 = puVar9;
        puVar7 = expandGroupLengths((uint8_t *)
                                    ((long)local_e0 +
                                    ((long)(int)((uint)puVar9[1] << 0x10) | (ulong)puVar9[2]) +
                                    (ulong)local_e0[2]),offsets,lengths);
        for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
          line = puVar7 + offsets[lVar6];
          puVar11 = lineLimit;
          if ((ulong)lengths[lVar6] != 0) {
            pLine = (uint8_t **)(line + lengths[lVar6]);
            uVar5 = calcNameSetLength(tokens,tokenCount,(uint8_t *)((ulong)uVar8 + (long)puVar2),
                                      tokenLengths,(uint32_t *)&line,pLine,lineLimit);
            puVar11 = (uint8_t *)((ulong)lineLimit & 0xffffffff);
            if ((int)lineLimit < (int)uVar5) {
              puVar11 = (uint8_t *)(ulong)uVar5;
            }
            if (((uint8_t **)line != pLine) &&
               (uVar5 = calcNameSetLength(tokens,tokenCount,(uint8_t *)((ulong)uVar8 + (long)puVar2)
                                          ,tokenLengths,(uint32_t *)&line,pLine,lineLimit),
               tokens = local_d0, (int)puVar11 < (int)uVar5)) {
              puVar11 = (uint8_t *)(ulong)uVar5;
            }
          }
          lineLimit = puVar11;
        }
        puVar9 = local_d8 + 3;
      }
      if (tokenLengths != (int8_t *)0x0) {
        uprv_free_63(tokenLengths);
      }
      gMaxNameLength = (int)lineLimit;
      UVar3 = '\x01';
    }
    return UVar3;
  }
  return '\x01';
}

Assistant:

static UBool
calcNameSetsLengths(UErrorCode *pErrorCode) {
    static const char extChars[]="0123456789ABCDEF<>-";
    int32_t i, maxNameLength;

    if(gMaxNameLength!=0) {
        return TRUE;
    }

    if(!isDataLoaded(pErrorCode)) {
        return FALSE;
    }

    /* set hex digits, used in various names, and <>-, used in extended names */
    for(i=0; i<(int32_t)sizeof(extChars)-1; ++i) {
        SET_ADD(gNameSet, extChars[i]);
    }

    /* set sets and lengths from algorithmic names */
    maxNameLength=calcAlgNameSetsLengths(0);

    /* set sets and lengths from extended names */
    maxNameLength=calcExtNameSetsLengths(maxNameLength);

    /* set sets and lengths from group names, set global maximum values */
    calcGroupNameSetsLengths(maxNameLength);

    return TRUE;
}